

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

void set_want_move_all_wins(Am_Object *root_window,bool want_move)

{
  bool bVar1;
  Am_Value *this;
  Am_Object win;
  Am_Object local_58;
  Am_Instance_Iterator local_50;
  Am_Instance_Iterator instance_iter;
  
  Am_Object::Am_Object(&local_50.prototype,root_window);
  Am_Instance_Iterator::Am_Instance_Iterator(&instance_iter,&local_50.prototype);
  Am_Object::~Am_Object(&local_50.prototype);
  win.data = (Am_Object_Data *)0x0;
  Am_Instance_Iterator::Start(&instance_iter);
  while( true ) {
    bVar1 = Am_Instance_Iterator::Last(&instance_iter);
    if (bVar1) break;
    Am_Instance_Iterator::Get(&local_50);
    Am_Object::operator=(&win,&local_50.current);
    Am_Object::~Am_Object(&local_50.current);
    this = Am_Object::Get(&win,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(this);
    if (bVar1) {
      Am_Object::Get_Owner(&local_50.current,(Am_Slot_Flags)&win);
      bVar1 = Am_Object::Valid(&local_50.current);
      Am_Object::~Am_Object(&local_50.current);
      if (bVar1) {
        Am_Object::Am_Object(&local_58,&win);
        set_want_move_one_win(&local_58,want_move);
        Am_Object::~Am_Object(&local_58);
      }
    }
    set_want_move_all_wins(&win,want_move);
    Am_Instance_Iterator::Next(&instance_iter);
  }
  Am_Object::~Am_Object(&win);
  Am_Instance_Iterator::~Am_Instance_Iterator(&instance_iter);
  return;
}

Assistant:

static void
set_want_move_all_wins(const Am_Object &root_window, bool want_move)
{
  Am_Instance_Iterator instance_iter(root_window);
  Am_Object win;
  for (instance_iter.Start(); !instance_iter.Last(); instance_iter.Next()) {
    win = instance_iter.Get();
    if ((bool)win.Get(Am_VISIBLE) && win.Get_Owner().Valid())
      //just visible windows
      set_want_move_one_win(win, want_move);
    //recurse on instance
    set_want_move_all_wins(win, want_move);
  }
}